

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O3

void * __thiscall
xercesc_4_0::DOMDocumentImpl::getUserData(DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  bool bVar3;
  ulong uVar4;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar5;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar6;
  XMLCh *pXVar7;
  XMLCh XVar8;
  
  if (this->fUserDataTable !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    pRVar2 = (this->fUserDataTableKeys).fHashTable;
    if ((key == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*key, uVar4 == 0)) {
      uVar4 = 0;
    }
    else {
      XVar8 = key[1];
      if (XVar8 != L'\0') {
        pXVar7 = key + 2;
        do {
          uVar4 = (ulong)(ushort)XVar8 + (uVar4 >> 0x18) + uVar4 * 0x26;
          XVar8 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar8 != L'\0');
      }
      uVar4 = uVar4 % pRVar2->fHashModulus;
    }
    pRVar6 = pRVar2->fBucketList[uVar4];
    if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      while (bVar3 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,key,pRVar6->fKey),
            !bVar3) {
        pRVar6 = pRVar6->fNext;
        if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
          return (void *)0x0;
        }
      }
      if ((pRVar6->fData != (PoolElem *)0x0) && (uVar1 = pRVar6->fData->fId, uVar1 != 0)) {
        pRVar5 = this->fUserDataTable->fBucketList[(ulong)n % this->fUserDataTable->fHashModulus];
        if (pRVar5 == (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                       *)0x0) {
          return (void *)0x0;
        }
        while ((pRVar5->fKey2 != uVar1 || ((DOMNodeImpl *)pRVar5->fKey1 != n))) {
          pRVar5 = pRVar5->fNext;
          if (pRVar5 == (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                         *)0x0) {
            return (void *)0x0;
          }
        }
        if (pRVar5->fData != (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0) {
          return pRVar5->fData->fKey;
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* DOMDocumentImpl::getUserData(const DOMNodeImpl* n, const XMLCh* key) const
{
    if (fUserDataTable) {
        unsigned int keyId=fUserDataTableKeys.getId(key);
        if(keyId!=0) {
            DOMUserDataRecord* dataRecord = fUserDataTable->get((void*)n, keyId);
            if (dataRecord)
                return dataRecord->getKey();
        }
    }

    return 0;
}